

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

bool basist::transcode_uastc_to_bc7
               (unpacked_uastc_block *unpacked_src_blk,bc7_optimization_results *dst_blk)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  uint8_t auVar6 [4];
  char cVar7;
  char cVar11;
  short sVar15;
  short sVar16;
  undefined1 auVar17 [15];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [14];
  undefined1 auVar25 [15];
  undefined1 auVar26 [14];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [13];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  unkuint9 Var37;
  undefined1 auVar38 [11];
  undefined1 auVar39 [14];
  undefined1 auVar40 [15];
  undefined1 auVar41 [11];
  undefined1 auVar42 [14];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  uint6 uVar47;
  uint8_t uVar48;
  byte bVar49;
  uint32_t i;
  uint32_t uVar50;
  uint8_t *puVar51;
  long lVar52;
  uint8_t uVar53;
  uint32_t astc_comp;
  uint uVar54;
  ulong uVar55;
  uint uVar56;
  uint8_t *puVar57;
  uint uVar58;
  ulong uVar59;
  ulong uVar60;
  uint32_t comp;
  ulong uVar61;
  uint32_t i_13;
  uint uVar62;
  long lVar63;
  color_quad_u8 *pcVar64;
  long lVar65;
  bool bVar66;
  undefined1 auVar67 [15];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  ushort uVar74;
  float fVar75;
  float fVar79;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [15];
  float best_err;
  float fVar81;
  short sVar82;
  ushort uVar83;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  ushort uVar88;
  float fVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  int iVar94;
  int iVar97;
  int iVar98;
  int iVar99;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  color_quad_u8 bestMinColor;
  color_quad_u8 bestMaxColor;
  uint32_t best_pbits [2];
  float xh [4];
  float xl [4];
  color_quad_u8 local_a8;
  color_quad_u8 local_a4;
  uint32_t local_a0 [2];
  undefined8 local_98;
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [4];
  undefined8 uStack_84;
  float fStack_7c;
  color_quad_u8 *local_70;
  ulong local_68;
  undefined1 *local_60;
  uint8_t *local_58;
  undefined1 *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar12;
  char cVar13;
  char cVar14;
  undefined4 uVar84;
  undefined6 uVar85;
  
  dst_blk->m_pbits[2] = (uint32_t  [2])0x0;
  dst_blk->m_index_selector = 0;
  dst_blk->m_rotation = 0;
  dst_blk->m_pbits[0] = (uint32_t  [2])0x0;
  dst_blk->m_pbits[1] = (uint32_t  [2])0x0;
  *(undefined8 *)(dst_blk->m_low + 2) = 0;
  dst_blk->m_high[1] = (uint8_t  [4])0x0;
  dst_blk->m_high[2] = (uint8_t  [4])0x0;
  dst_blk->m_alpha_selectors[8] = '\0';
  dst_blk->m_alpha_selectors[9] = '\0';
  dst_blk->m_alpha_selectors[10] = '\0';
  dst_blk->m_alpha_selectors[0xb] = '\0';
  dst_blk->m_alpha_selectors[0xc] = '\0';
  dst_blk->m_alpha_selectors[0xd] = '\0';
  dst_blk->m_alpha_selectors[0xe] = '\0';
  dst_blk->m_alpha_selectors[0xf] = '\0';
  dst_blk->m_low[0] = (uint8_t  [4])0x0;
  dst_blk->m_low[1] = (uint8_t  [4])0x0;
  dst_blk->m_selectors[8] = '\0';
  dst_blk->m_selectors[9] = '\0';
  dst_blk->m_selectors[10] = '\0';
  dst_blk->m_selectors[0xb] = '\0';
  dst_blk->m_selectors[0xc] = '\0';
  dst_blk->m_selectors[0xd] = '\0';
  dst_blk->m_selectors[0xe] = '\0';
  dst_blk->m_selectors[0xf] = '\0';
  dst_blk->m_alpha_selectors[0] = '\0';
  dst_blk->m_alpha_selectors[1] = '\0';
  dst_blk->m_alpha_selectors[2] = '\0';
  dst_blk->m_alpha_selectors[3] = '\0';
  dst_blk->m_alpha_selectors[4] = '\0';
  dst_blk->m_alpha_selectors[5] = '\0';
  dst_blk->m_alpha_selectors[6] = '\0';
  dst_blk->m_alpha_selectors[7] = '\0';
  dst_blk->m_mode = 0;
  dst_blk->m_partition = 0;
  dst_blk->m_selectors[0] = '\0';
  dst_blk->m_selectors[1] = '\0';
  dst_blk->m_selectors[2] = '\0';
  dst_blk->m_selectors[3] = '\0';
  dst_blk->m_selectors[4] = '\0';
  dst_blk->m_selectors[5] = '\0';
  dst_blk->m_selectors[6] = '\0';
  dst_blk->m_selectors[7] = '\0';
  uVar54 = unpacked_src_blk->m_mode;
  uVar55 = (ulong)uVar54;
  if (0x12 < uVar55) {
    return false;
  }
  bVar1 = g_uastc_mode_endpoint_ranges[uVar55];
  bVar49 = g_uastc_mode_comps[uVar55];
  switch(uVar55) {
  default:
    dst_blk->m_mode = 6;
    local_88 = (undefined1  [4])
               ((float)(byte)g_astc_unquant
                             [(ulong)(unpacked_src_blk->m_astc).m_endpoints[0] * 2 +
                              (ulong)bVar1 * 0x200] / 255.0);
    if (uVar55 - 0xf < 3) {
      fStack_90 = (float)(byte)g_astc_unquant
                               [(ulong)(unpacked_src_blk->m_astc).m_endpoints[1] * 2 +
                                (ulong)bVar1 * 0x200] / 255.0;
      uStack_84._0_4_ = (float)local_88;
      local_98 = CONCAT44(fStack_90,fStack_90);
      uStack_84._4_4_ = (float)local_88;
      fStack_7c = (float)(byte)g_astc_unquant
                               [(ulong)(unpacked_src_blk->m_astc).m_endpoints[2] * 2 +
                                (ulong)bVar1 * 0x200] / 255.0;
      fStack_8c = (float)(byte)g_astc_unquant
                               [(ulong)(unpacked_src_blk->m_astc).m_endpoints[3] * 2 +
                                (ulong)bVar1 * 0x200] / 255.0;
      bVar49 = 4;
    }
    else {
      auVar68._0_4_ =
           (float)(byte)g_astc_unquant
                        [(ulong)(unpacked_src_blk->m_astc).m_endpoints[2] * 2 + (ulong)bVar1 * 0x200
                        ];
      auVar68._4_4_ =
           (float)(byte)g_astc_unquant
                        [(ulong)(unpacked_src_blk->m_astc).m_endpoints[4] * 2 + (ulong)bVar1 * 0x200
                        ];
      auVar68._8_8_ = 0;
      auVar69 = divps(auVar68,_DAT_001e9930);
      uStack_84 = auVar69._0_8_;
      auVar70._0_4_ =
           (float)(byte)g_astc_unquant
                        [(ulong)(unpacked_src_blk->m_astc).m_endpoints[1] * 2 + (ulong)bVar1 * 0x200
                        ];
      auVar70._4_4_ =
           (float)(byte)g_astc_unquant
                        [(ulong)(unpacked_src_blk->m_astc).m_endpoints[3] * 2 + (ulong)bVar1 * 0x200
                        ];
      auVar70._8_8_ = 0;
      auVar69 = divps(auVar70,_DAT_001e9930);
      local_98 = auVar69._0_8_;
      fStack_90 = (float)(byte)g_astc_unquant
                               [(ulong)(unpacked_src_blk->m_astc).m_endpoints[5] * 2 +
                                (ulong)bVar1 * 0x200] / 255.0;
      if (uVar55 - 8 < 7) {
        fStack_7c = (float)(byte)g_astc_unquant
                                 [(ulong)(unpacked_src_blk->m_astc).m_endpoints[6] * 2 +
                                  (ulong)bVar1 * 0x200] / 255.0;
        fStack_8c = (float)(byte)g_astc_unquant
                                 [(ulong)(unpacked_src_blk->m_astc).m_endpoints[7] * 2 +
                                  (ulong)bVar1 * 0x200] / 255.0;
      }
      else {
        fStack_7c = 1.0;
        fStack_8c = 1.0;
      }
    }
    determine_unique_pbits
              ((uint)bVar49,7,(float *)local_88,(float *)&local_98,&local_a8,&local_a4,local_a0);
    *&dst_blk->m_low[0].m_c = local_a8.m_c;
    *&dst_blk->m_high[0].m_c = local_a4.m_c;
    if (uVar55 - 0x12 < 0xfffffffffffffff6) {
      dst_blk->m_low[0].m_c[3] = '\x7f';
      dst_blk->m_high[0].m_c[3] = '\x7f';
    }
    dst_blk->m_pbits[0] = local_a0;
    if ((int)uVar54 < 0xe) {
      if ((uVar54 == 5) || (uVar54 == 0xc)) {
        lVar52 = 0;
        do {
          dst_blk->m_selectors[lVar52] =
               (&DAT_0026bc7c)[(unpacked_src_blk->m_astc).m_weights[lVar52]];
          lVar52 = lVar52 + 1;
        } while (lVar52 != 0x10);
        return true;
      }
    }
    else {
      if (uVar54 == 0x12) {
        lVar52 = 0;
        do {
          dst_blk->m_selectors[lVar52] =
               (&DAT_0026bcc0)[(unpacked_src_blk->m_astc).m_weights[lVar52]];
          lVar52 = lVar52 + 1;
        } while (lVar52 != 0x10);
        return true;
      }
      if (uVar54 == 0xe) {
        lVar52 = 0;
        do {
          dst_blk->m_selectors[lVar52] =
               (&DAT_001e9b5c)[(unpacked_src_blk->m_astc).m_weights[lVar52]];
          lVar52 = lVar52 + 1;
        } while (lVar52 != 0x10);
        return true;
      }
    }
    lVar52 = 0;
    do {
      dst_blk->m_selectors[lVar52] = (unpacked_src_blk->m_astc).m_weights[lVar52];
      lVar52 = lVar52 + 1;
    } while (lVar52 != 0x10);
    break;
  case 1:
    dst_blk->m_mode = 3;
    auVar17 = DAT_001e9670._0_15_;
    auVar69 = psllw(ZEXT116((unpacked_src_blk->m_astc).m_endpoints[2]),8);
    auVar80 = ~auVar17 & auVar69._0_15_ |
              SUB1615(*(undefined1 (*) [16])(unpacked_src_blk->m_astc).m_endpoints,0) & auVar17;
    auVar67[0xd] = 0;
    auVar67._0_13_ = auVar80._0_13_;
    auVar67[0xe] = auVar80[7];
    auVar20[0xc] = auVar80[6];
    auVar20._0_12_ = auVar80._0_12_;
    auVar20._13_2_ = auVar67._13_2_;
    auVar21[0xb] = 0;
    auVar21._0_11_ = auVar80._0_11_;
    auVar21._12_3_ = auVar20._12_3_;
    auVar23[10] = auVar80[5];
    auVar23._0_10_ = auVar80._0_10_;
    auVar23._11_4_ = auVar21._11_4_;
    auVar27[9] = 0;
    auVar27._0_9_ = auVar80._0_9_;
    auVar27._10_5_ = auVar23._10_5_;
    auVar29[8] = auVar80[4];
    auVar29._0_8_ = auVar80._0_8_;
    auVar29._9_6_ = auVar27._9_6_;
    auVar36._7_8_ = 0;
    auVar36._0_7_ = auVar29._8_7_;
    Var37 = CONCAT81(SUB158(auVar36 << 0x40,7),auVar80[3]);
    auVar43._9_6_ = 0;
    auVar43._0_9_ = Var37;
    auVar38._1_10_ = SUB1510(auVar43 << 0x30,5);
    auVar38[0] = auVar80[2];
    auVar44._11_4_ = 0;
    auVar44._0_11_ = auVar38;
    auVar32[2] = auVar80[1];
    auVar32._0_2_ = auVar80._0_2_;
    auVar32._3_12_ = SUB1512(auVar44 << 0x20,3);
    auVar34._2_13_ = auVar32._2_13_;
    auVar34._0_2_ = auVar80._0_2_ & 0xff;
    auVar18._10_2_ = 0;
    auVar18._0_10_ = auVar34._0_10_;
    auVar18._12_2_ = (short)Var37;
    uVar47 = CONCAT42(auVar18._10_4_,auVar38._0_2_);
    auVar39._6_8_ = 0;
    auVar39._0_6_ = uVar47;
    auVar24._4_2_ = auVar32._2_2_;
    auVar24._0_4_ = auVar34._0_4_;
    auVar24._6_8_ = SUB148(auVar39 << 0x40,6);
    auVar76._0_4_ = (float)(auVar34._0_4_ & 0xffff);
    auVar76._4_4_ = (float)auVar24._4_4_;
    auVar76._8_4_ = (float)(int)uVar47;
    auVar76._12_4_ = (float)(auVar18._10_4_ >> 0x10);
    auVar69 = divps(auVar76,_DAT_001e9930);
    uStack_84._4_4_ = (float)(unpacked_src_blk->m_astc).m_endpoints[4] / 255.0;
    _local_88 = auVar69._0_8_;
    fStack_7c = 1.0;
    auVar69 = psllw(ZEXT416(*(uint *)((unpacked_src_blk->m_astc).m_endpoints + 3)),8);
    auVar67 = ~auVar17 & auVar69._0_15_ |
              SUB1615(*(undefined1 (*) [16])((unpacked_src_blk->m_astc).m_endpoints + 1),0) &
              auVar17;
    auVar17[0xd] = 0;
    auVar17._0_13_ = auVar67._0_13_;
    auVar17[0xe] = auVar67[7];
    auVar80[0xc] = auVar67[6];
    auVar80._0_12_ = auVar67._0_12_;
    auVar80._13_2_ = auVar17._13_2_;
    auVar22[0xb] = 0;
    auVar22._0_11_ = auVar67._0_11_;
    auVar22._12_3_ = auVar80._12_3_;
    auVar25[10] = auVar67[5];
    auVar25._0_10_ = auVar67._0_10_;
    auVar25._11_4_ = auVar22._11_4_;
    auVar28[9] = 0;
    auVar28._0_9_ = auVar67._0_9_;
    auVar28._10_5_ = auVar25._10_5_;
    auVar30[8] = auVar67[4];
    auVar30._0_8_ = auVar67._0_8_;
    auVar30._9_6_ = auVar28._9_6_;
    auVar40._7_8_ = 0;
    auVar40._0_7_ = auVar30._8_7_;
    Var37 = CONCAT81(SUB158(auVar40 << 0x40,7),auVar67[3]);
    auVar45._9_6_ = 0;
    auVar45._0_9_ = Var37;
    auVar41._1_10_ = SUB1510(auVar45 << 0x30,5);
    auVar41[0] = auVar67[2];
    auVar46._11_4_ = 0;
    auVar46._0_11_ = auVar41;
    auVar33[2] = auVar67[1];
    auVar33._0_2_ = auVar67._0_2_;
    auVar33._3_12_ = SUB1512(auVar46 << 0x20,3);
    auVar35._2_13_ = auVar33._2_13_;
    auVar35._0_2_ = auVar67._0_2_ & 0xff;
    auVar19._10_2_ = 0;
    auVar19._0_10_ = auVar35._0_10_;
    auVar19._12_2_ = (short)Var37;
    uVar47 = CONCAT42(auVar19._10_4_,auVar41._0_2_);
    auVar42._6_8_ = 0;
    auVar42._0_6_ = uVar47;
    auVar26._4_2_ = auVar33._2_2_;
    auVar26._0_4_ = auVar35._0_4_;
    auVar26._6_8_ = SUB148(auVar42 << 0x40,6);
    auVar73._0_4_ = (float)(auVar35._0_4_ & 0xffff);
    auVar73._4_4_ = (float)auVar26._4_4_;
    auVar73._8_4_ = (float)(int)uVar47;
    auVar73._12_4_ = (float)(auVar19._10_4_ >> 0x10);
    auVar69 = divps(auVar73,_DAT_001e9930);
    local_98 = auVar69._0_8_;
    fStack_90 = (float)(unpacked_src_blk->m_astc).m_endpoints[5] / 255.0;
    fStack_8c = 1.0;
    lVar52 = 0;
    local_a8.m_c[0] = '\0';
    local_a8.m_c[1] = '\0';
    local_a8.m_c[2] = '\0';
    local_a8.m_c[3] = '\0';
    local_a4.m_c[0] = '\0';
    local_a4.m_c[1] = '\0';
    local_a4.m_c[2] = '\0';
    local_a4.m_c[3] = '\0';
    determine_unique_pbits(3,7,(float *)local_88,(float *)&local_98,&local_a8,&local_a4,local_a0);
    dst_blk->m_low[0].m_c[2] = local_a8.m_c[2];
    *(undefined2 *)dst_blk->m_low[0].m_c = local_a8.m_c._0_2_;
    *(undefined2 *)dst_blk->m_low[1].m_c = local_a8.m_c._0_2_;
    dst_blk->m_low[1].m_c[2] = local_a8.m_c[2];
    do {
      uVar48 = local_a4.m_c[lVar52];
      dst_blk->m_high[0].m_c[lVar52] = uVar48;
      dst_blk->m_high[1].m_c[lVar52] = uVar48;
      lVar52 = lVar52 + 1;
    } while (lVar52 != 3);
    dst_blk->m_pbits[0][0] = local_a0[0];
    dst_blk->m_pbits[0][1] = local_a0[1];
    dst_blk->m_pbits[1][0] = local_a0[0];
    dst_blk->m_pbits[1][1] = local_a0[1];
    lVar52 = 0;
    do {
      dst_blk->m_selectors[lVar52] = (unpacked_src_blk->m_astc).m_weights[lVar52];
      lVar52 = lVar52 + 1;
    } while (lVar52 != 0x10);
    break;
  case 2:
    dst_blk->m_mode = 1;
    dst_blk->m_partition =
         (uint)(byte)g_astc_bc7_common_partitions2[(ulong)unpacked_src_blk->m_common_pattern * 6];
    auVar72 = _DAT_001e9930;
    auVar69 = _DAT_001e9650;
    cVar5 = g_astc_bc7_common_partitions2[(ulong)unpacked_src_blk->m_common_pattern * 6 + 4];
    fStack_7c = 1.0;
    puVar57 = (unpacked_src_blk->m_astc).m_endpoints + 1;
    uVar55 = 0;
    do {
      lVar52 = 0;
      do {
        *(float *)(local_88 + lVar52 * 4) =
             (float)((uint)puVar57[lVar52 * 2 + -1] << 4 | (uint)puVar57[lVar52 * 2 + -1]) / 255.0;
        *(float *)((long)&local_98 + lVar52 * 4) =
             (float)((uint)puVar57[lVar52 * 2] << 4 | (uint)puVar57[lVar52 * 2]) / 255.0;
        lVar52 = lVar52 + 1;
      } while (lVar52 != 3);
      uVar56 = 0;
      uVar58 = 0;
      uVar50 = 0;
      fVar81 = 1e+09;
      uVar54 = 0;
      do {
        fVar89 = (float)(int)uVar54;
        uVar62 = uVar54 | 0x7e;
        auVar91._4_4_ = uVar54;
        auVar91._0_4_ = uVar54;
        auVar91._8_4_ = uVar54;
        auVar91._12_4_ = uVar54;
        auVar77._0_8_ = CONCAT44(uVar54,uVar54) | 0x7e0000007e;
        auVar77._8_4_ = uVar62;
        auVar77._12_4_ = uVar62;
        iVar94 = (int)(((float)local_88 * 127.0 - fVar89) * 0.5 + 0.5);
        iVar97 = (int)(((float)uStack_84 * 127.0 - fVar89) * 0.5 + 0.5);
        iVar98 = (int)((uStack_84._4_4_ * 127.0 - fVar89) * 0.5 + 0.5);
        iVar99 = (int)((fStack_7c * 127.0 - fVar89) * 0.5 + 0.5);
        auVar86._0_4_ = -(uint)(iVar94 < 0);
        auVar86._4_4_ = -(uint)(iVar97 < 0);
        auVar86._8_4_ = -(uint)(iVar98 < 0);
        auVar86._12_4_ = -(uint)(iVar99 < 0);
        auVar95._0_4_ = iVar94 * 2 + uVar54;
        auVar95._4_4_ = iVar97 * 2 + uVar54;
        auVar95._8_4_ = iVar98 * 2 + uVar54;
        auVar95._12_4_ = iVar99 * 2 + uVar54;
        auVar92._0_4_ = -(uint)(auVar95._0_4_ < (int)uVar62);
        auVar92._4_4_ = -(uint)(auVar95._4_4_ < (int)uVar62);
        auVar92._8_4_ = -(uint)(auVar95._8_4_ < (int)uVar62);
        auVar92._12_4_ = -(uint)(auVar95._12_4_ < (int)uVar62);
        auVar87 = (~auVar86 & (~auVar92 & auVar77 | auVar95 & auVar92) | auVar91 & auVar86) &
                  auVar69;
        sVar15 = auVar87._0_2_;
        cVar7 = (0 < sVar15) * (sVar15 < 0x100) * auVar87[0] - (0xff < sVar15);
        sVar15 = auVar87._2_2_;
        sVar82 = CONCAT11((0 < sVar15) * (sVar15 < 0x100) * auVar87[2] - (0xff < sVar15),cVar7);
        sVar15 = auVar87._4_2_;
        cVar8 = (0 < sVar15) * (sVar15 < 0x100) * auVar87[4] - (0xff < sVar15);
        sVar15 = auVar87._6_2_;
        uVar84 = CONCAT13((0 < sVar15) * (sVar15 < 0x100) * auVar87[6] - (0xff < sVar15),
                          CONCAT12(cVar8,sVar82));
        sVar15 = auVar87._8_2_;
        cVar9 = (0 < sVar15) * (sVar15 < 0x100) * auVar87[8] - (0xff < sVar15);
        sVar15 = auVar87._10_2_;
        uVar85 = CONCAT15((0 < sVar15) * (sVar15 < 0x100) * auVar87[10] - (0xff < sVar15),
                          CONCAT14(cVar9,uVar84));
        sVar15 = auVar87._12_2_;
        cVar10 = (0 < sVar15) * (sVar15 < 0x100) * auVar87[0xc] - (0xff < sVar15);
        sVar16 = auVar87._14_2_;
        cVar7 = (0 < sVar82) * (sVar82 < 0x100) * cVar7 - (0xff < sVar82);
        sVar15 = (short)((uint)uVar84 >> 0x10);
        cVar8 = (0 < sVar15) * (sVar15 < 0x100) * cVar8 - (0xff < sVar15);
        uVar83 = CONCAT11(cVar8,cVar7);
        sVar15 = (short)((uint6)uVar85 >> 0x20);
        cVar9 = (0 < sVar15) * (sVar15 < 0x100) * cVar9 - (0xff < sVar15);
        sVar15 = (short)(CONCAT17((0 < sVar16) * (sVar16 < 0x100) * auVar87[0xe] - (0xff < sVar16),
                                  CONCAT16(cVar10,uVar85)) >> 0x30);
        cVar10 = (0 < sVar15) * (sVar15 < 0x100) * cVar10 - (0xff < sVar15);
        iVar94 = (int)(((float)local_98 * 127.0 - fVar89) * 0.5 + 0.5);
        iVar97 = (int)((local_98._4_4_ * 127.0 - fVar89) * 0.5 + 0.5);
        iVar98 = (int)((fStack_90 * 127.0 - fVar89) * 0.5 + 0.5);
        iVar99 = (int)((127.0 - fVar89) * 0.5 + 0.5);
        auVar90._0_4_ = -(uint)(iVar94 < 0);
        auVar90._4_4_ = -(uint)(iVar97 < 0);
        auVar90._8_4_ = -(uint)(iVar98 < 0);
        auVar90._12_4_ = -(uint)(iVar99 < 0);
        auVar93._0_4_ = iVar94 * 2 + uVar54;
        auVar93._4_4_ = iVar97 * 2 + uVar54;
        auVar93._8_4_ = iVar98 * 2 + uVar54;
        auVar93._12_4_ = iVar99 * 2 + uVar54;
        auVar96._0_4_ = -(uint)(auVar93._0_4_ < (int)uVar62);
        auVar96._4_4_ = -(uint)(auVar93._4_4_ < (int)uVar62);
        auVar96._8_4_ = -(uint)(auVar93._8_4_ < (int)uVar62);
        auVar96._12_4_ = -(uint)(auVar93._12_4_ < (int)uVar62);
        auVar87 = (~auVar90 & (~auVar96 & auVar77 | auVar93 & auVar96) | auVar91 & auVar90) &
                  auVar69;
        sVar15 = auVar87._0_2_;
        cVar11 = (0 < sVar15) * (sVar15 < 0x100) * auVar87[0] - (0xff < sVar15);
        sVar15 = auVar87._2_2_;
        sVar82 = CONCAT11((0 < sVar15) * (sVar15 < 0x100) * auVar87[2] - (0xff < sVar15),cVar11);
        sVar15 = auVar87._4_2_;
        cVar12 = (0 < sVar15) * (sVar15 < 0x100) * auVar87[4] - (0xff < sVar15);
        sVar15 = auVar87._6_2_;
        uVar84 = CONCAT13((0 < sVar15) * (sVar15 < 0x100) * auVar87[6] - (0xff < sVar15),
                          CONCAT12(cVar12,sVar82));
        sVar15 = auVar87._8_2_;
        cVar13 = (0 < sVar15) * (sVar15 < 0x100) * auVar87[8] - (0xff < sVar15);
        sVar15 = auVar87._10_2_;
        uVar85 = CONCAT15((0 < sVar15) * (sVar15 < 0x100) * auVar87[10] - (0xff < sVar15),
                          CONCAT14(cVar13,uVar84));
        sVar15 = auVar87._12_2_;
        cVar14 = (0 < sVar15) * (sVar15 < 0x100) * auVar87[0xc] - (0xff < sVar15);
        sVar16 = auVar87._14_2_;
        cVar11 = (0 < sVar82) * (sVar82 < 0x100) * cVar11 - (0xff < sVar82);
        sVar15 = (short)((uint)uVar84 >> 0x10);
        cVar12 = (0 < sVar15) * (sVar15 < 0x100) * cVar12 - (0xff < sVar15);
        uVar88 = CONCAT11(cVar12,cVar11);
        sVar15 = (short)((uint6)uVar85 >> 0x20);
        cVar13 = (0 < sVar15) * (sVar15 < 0x100) * cVar13 - (0xff < sVar15);
        sVar15 = (short)(CONCAT17((0 < sVar16) * (sVar16 < 0x100) * auVar87[0xe] - (0xff < sVar16),
                                  CONCAT16(cVar14,uVar85)) >> 0x30);
        cVar14 = (0 < sVar15) * (sVar15 < 0x100) * cVar14 - (0xff < sVar15);
        uVar74 = CONCAT11(cVar8 * '\x02',cVar7 * '\x02');
        uVar62 = CONCAT13(cVar10 * '\x02',CONCAT12(cVar9 * '\x02',uVar74));
        local_a0[0] = CONCAT22((ushort)(uVar62 >> 0x17),uVar74 >> 7) & 0x1010101 | uVar62;
        uVar74 = CONCAT11(cVar12 * '\x02',cVar11 * '\x02');
        uVar62 = CONCAT13(cVar14 * '\x02',CONCAT12(cVar13 * '\x02',uVar74));
        auVar6 = (uint8_t  [4])(CONCAT22((ushort)(uVar62 >> 0x17),uVar74 >> 7) & 0x1010101 | uVar62)
        ;
        local_a8.m_c[0] = auVar6[0];
        local_a8.m_c[1] = auVar6[1];
        local_a8.m_c[2] = auVar6[2];
        local_a8.m_c[3] = auVar6[3];
        fVar89 = 0.0;
        lVar52 = 0;
        do {
          auVar78._0_4_ = (float)*(byte *)((long)local_a0 + lVar52);
          auVar78._4_4_ = (float)local_a8.m_c[lVar52];
          auVar78._8_8_ = 0;
          auVar87 = divps(auVar78,auVar72);
          fVar75 = auVar87._0_4_ - *(float *)(local_88 + lVar52 * 4);
          fVar79 = auVar87._4_4_ - *(float *)((long)&local_98 + lVar52 * 4);
          fVar89 = fVar89 + fVar79 * fVar79 + fVar75 * fVar75;
          lVar52 = lVar52 + 1;
        } while (lVar52 != 3);
        if (fVar89 < fVar81) {
          uVar56 = CONCAT22((ushort)(CONCAT13(cVar10,CONCAT12(cVar9,uVar83)) >> 0x11),uVar83 >> 1) &
                   0x7f7f7f7f;
          uVar58 = CONCAT22((ushort)(CONCAT13(cVar14,CONCAT12(cVar13,uVar88)) >> 0x11),uVar88 >> 1)
                   & 0x7f7f7f7f;
          fVar81 = fVar89;
          uVar50 = uVar54;
        }
        bVar66 = uVar54 == 0;
        uVar54 = uVar54 + 1;
      } while (bVar66);
      uVar59 = (ulong)(1 - (int)uVar55);
      if (cVar5 == '\0') {
        uVar59 = uVar55 & 0xffffffff;
      }
      dst_blk->m_low[uVar59].m_c[2] = (uint8_t)(uVar56 >> 0x10);
      *(short *)dst_blk->m_low[uVar59].m_c = (short)uVar56;
      dst_blk->m_high[uVar59].m_c[2] = (uint8_t)(uVar58 >> 0x10);
      *(short *)dst_blk->m_high[uVar59].m_c = (short)uVar58;
      dst_blk->m_pbits[uVar59][0] = uVar50;
      puVar57 = puVar57 + 6;
      bVar66 = uVar55 == 0;
      uVar55 = uVar55 + 1;
    } while (bVar66);
    lVar52 = 0;
    do {
      dst_blk->m_selectors[lVar52] = (unpacked_src_blk->m_astc).m_weights[lVar52];
      lVar52 = lVar52 + 1;
    } while (lVar52 != 0x10);
    break;
  case 3:
    dst_blk->m_mode = 2;
    dst_blk->m_partition =
         (uint)(byte)g_astc_bc7_common_partitions3[(ulong)unpacked_src_blk->m_common_pattern * 6];
    bVar49 = g_astc_bc7_common_partitions3[(ulong)unpacked_src_blk->m_common_pattern * 6 + 4];
    puVar57 = (unpacked_src_blk->m_astc).m_endpoints + 1;
    lVar52 = 0;
    do {
      bVar2 = g_astc_to_bc7_partition_index_perm_tables[lVar52 + (ulong)bVar49 * 3];
      lVar63 = 0;
      do {
        bVar3 = g_astc_unquant[(ulong)puVar57[lVar63 * 2 + -1] * 2 + (ulong)bVar1 * 0x200];
        bVar4 = g_astc_unquant[(ulong)puVar57[lVar63 * 2] * 2 + (ulong)bVar1 * 0x200];
        dst_blk->m_low[bVar2].m_c[lVar63] =
             (uint8_t)((((uint)bVar3 * 0x20 - (uint)bVar3) + 0x7f & 0xffff) * 0x4041 >> 0x16);
        dst_blk->m_high[bVar2].m_c[lVar63] =
             (uint8_t)((((uint)bVar4 * 0x20 - (uint)bVar4) + 0x7f & 0xffff) * 0x4041 >> 0x16);
        lVar63 = lVar63 + 1;
      } while (lVar63 != 3);
      lVar52 = lVar52 + 1;
      puVar57 = puVar57 + 6;
    } while (lVar52 != 3);
    lVar52 = 0;
    do {
      dst_blk->m_selectors[lVar52] = (unpacked_src_blk->m_astc).m_weights[lVar52];
      lVar52 = lVar52 + 1;
    } while (lVar52 != 0x10);
    break;
  case 4:
    dst_blk->m_mode = 3;
    dst_blk->m_partition =
         (uint)(byte)g_astc_bc7_common_partitions2[(ulong)unpacked_src_blk->m_common_pattern * 6];
    local_68 = CONCAT71(local_68._1_7_,
                        g_astc_bc7_common_partitions2
                        [(ulong)unpacked_src_blk->m_common_pattern * 6 + 4]);
    fStack_7c = 1.0;
    fStack_8c = 1.0;
    local_70 = dst_blk->m_low;
    puVar57 = (unpacked_src_blk->m_astc).m_endpoints + 1;
    uVar55 = 0;
    do {
      lVar52 = 0;
      do {
        *(float *)(local_88 + lVar52 * 4) =
             (float)(byte)g_astc_unquant[(ulong)puVar57[lVar52 * 2 + -1] * 2 + (ulong)bVar1 * 0x200]
             / 255.0;
        *(float *)((long)&local_98 + lVar52 * 4) =
             (float)(byte)g_astc_unquant[(ulong)puVar57[lVar52 * 2] * 2 + (ulong)bVar1 * 0x200] /
             255.0;
        lVar52 = lVar52 + 1;
      } while (lVar52 != 3);
      local_a0[0] = 0;
      local_a0[1] = 0;
      local_a8.m_c[0] = '\0';
      local_a8.m_c[1] = '\0';
      local_a8.m_c[2] = '\0';
      local_a8.m_c[3] = '\0';
      local_a4.m_c[0] = '\0';
      local_a4.m_c[1] = '\0';
      local_a4.m_c[2] = '\0';
      local_a4.m_c[3] = '\0';
      determine_unique_pbits(3,7,(float *)local_88,(float *)&local_98,&local_a8,&local_a4,local_a0);
      uVar59 = (ulong)(1 - (int)uVar55);
      if ((char)local_68 == '\0') {
        uVar59 = uVar55 & 0xffffffff;
      }
      local_70[uVar59].m_c[2] = local_a8.m_c[2];
      *(undefined2 *)local_70[uVar59].m_c = local_a8.m_c._0_2_;
      dst_blk->m_high[uVar59].m_c[2] = local_a4.m_c[2];
      *(undefined2 *)dst_blk->m_high[uVar59].m_c = local_a4.m_c._0_2_;
      dst_blk->m_low[uVar59].m_c[3] = '\x7f';
      dst_blk->m_high[uVar59].m_c[3] = '\x7f';
      dst_blk->m_pbits[uVar59] = local_a0;
      puVar57 = puVar57 + 6;
      bVar66 = uVar55 == 0;
      uVar55 = uVar55 + 1;
    } while (bVar66);
    lVar52 = 0;
    do {
      dst_blk->m_selectors[lVar52] = (unpacked_src_blk->m_astc).m_weights[lVar52];
      lVar52 = lVar52 + 1;
    } while (lVar52 != 0x10);
    break;
  case 6:
  case 0xb:
  case 0xd:
  case 0x11:
    dst_blk->m_mode = 5;
    dst_blk->m_rotation = (unpacked_src_blk->m_astc).m_ccs + 1U & 3;
    if (uVar55 - 0xf < 3) {
      if ((unpacked_src_blk->m_astc).m_ccs != 3) {
        __assert_fail("unpacked_src_blk.m_astc.m_ccs == 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x3379,
                      "bool basist::transcode_uastc_to_bc7(const unpacked_uastc_block &, bc7_optimization_results &)"
                     );
      }
      uVar53 = (uint8_t)(((uint)(byte)g_astc_unquant
                                      [(ulong)(unpacked_src_blk->m_astc).m_endpoints[0] * 2 +
                                       (ulong)bVar1 * 0x200] * 0x7f + 0x7f) / 0xff);
      dst_blk->m_low[0].m_c[0] = uVar53;
      uVar48 = (uint8_t)(((uint)(byte)g_astc_unquant
                                      [(ulong)(unpacked_src_blk->m_astc).m_endpoints[1] * 2 +
                                       (ulong)bVar1 * 0x200] * 0x7f + 0x7f) / 0xff);
      dst_blk->m_high[0].m_c[0] = uVar48;
      dst_blk->m_low[0].m_c[1] = uVar53;
      dst_blk->m_high[0].m_c[1] = uVar48;
      dst_blk->m_low[0].m_c[2] = uVar53;
      dst_blk->m_high[0].m_c[2] = uVar48;
      dst_blk->m_low[0].m_c[3] =
           g_astc_unquant
           [(ulong)(unpacked_src_blk->m_astc).m_endpoints[2] * 2 + (ulong)bVar1 * 0x200];
      dst_blk->m_high[0].m_c[3] =
           g_astc_unquant
           [(ulong)(unpacked_src_blk->m_astc).m_endpoints[3] * 2 + (ulong)bVar1 * 0x200];
    }
    else {
      uVar55 = 0;
      do {
        uVar56 = (unpacked_src_blk->m_astc).m_ccs;
        uVar58 = (uint)uVar55;
        if (uVar55 == 3) {
          uVar58 = uVar56;
        }
        if (uVar55 == uVar56) {
          uVar58 = 3;
        }
        uVar59 = 0xff;
        uVar61 = 0xff;
        if (uVar55 < bVar49) {
          uVar59 = (ulong)(byte)g_astc_unquant
                                [(ulong)(unpacked_src_blk->m_astc).m_endpoints[uVar55 * 2] * 2 +
                                 (ulong)bVar1 * 0x200];
          uVar61 = (ulong)(byte)g_astc_unquant
                                [(ulong)(unpacked_src_blk->m_astc).m_endpoints[uVar55 * 2 + 1] * 2 +
                                 (ulong)bVar1 * 0x200];
        }
        if (uVar58 < 3) {
          uVar59 = (ulong)((int)uVar59 * 0x7f + 0x7f) / 0xff;
          uVar61 = (ulong)((int)uVar61 * 0x7f + 0x7f) / 0xff;
        }
        dst_blk->m_low[0].m_c[uVar58] = (uint8_t)uVar59;
        dst_blk->m_high[0].m_c[uVar58] = (uint8_t)uVar61;
        uVar55 = uVar55 + 1;
      } while (uVar55 != 4);
    }
    lVar52 = 0;
    if (uVar54 == 0xd) {
      do {
        dst_blk->m_selectors[lVar52] =
             ((unpacked_src_blk->m_astc).m_weights[lVar52 * 2] != '\0') * '\x03';
        dst_blk->m_alpha_selectors[lVar52] =
             ((unpacked_src_blk->m_astc).m_weights[lVar52 * 2 + 1] != '\0') * '\x03';
        lVar52 = lVar52 + 1;
      } while (lVar52 != 0x10);
    }
    else {
      do {
        dst_blk->m_selectors[lVar52] = (unpacked_src_blk->m_astc).m_weights[lVar52 * 2];
        dst_blk->m_alpha_selectors[lVar52] = (unpacked_src_blk->m_astc).m_weights[lVar52 * 2 + 1];
        lVar52 = lVar52 + 1;
      } while (lVar52 != 0x10);
    }
    break;
  case 7:
    dst_blk->m_mode = 2;
    dst_blk->m_partition =
         (uint)(byte)g_bc7_3_astc2_common_partitions[(ulong)unpacked_src_blk->m_common_pattern * 6];
    local_68 = CONCAT44(local_68._4_4_,
                        (uint)(byte)g_bc7_3_astc2_common_partitions
                                    [(ulong)unpacked_src_blk->m_common_pattern * 6 + 4]);
    pcVar64 = dst_blk->m_high;
    local_70 = (color_quad_u8 *)((unpacked_src_blk->m_astc).m_endpoints + 1);
    lVar52 = 0;
    do {
      uVar50 = bc7_convert_partition_index_3_to_2((uint32_t)lVar52,(uint32_t)local_68);
      lVar63 = 0;
      do {
        pcVar64[-3].m_c[lVar63] =
             (uint8_t)(((uint)(byte)g_astc_unquant
                                    [(ulong)*(uint8_t *)
                                             ((long)local_70 +
                                             lVar63 * 2 + ((ulong)(uVar50 * 6) - 1)) * 2 +
                                     (ulong)bVar1 * 0x200] * 0x1f + 0x7f) / 0xff);
        pcVar64->m_c[lVar63] =
             (uint8_t)(((uint)(byte)g_astc_unquant
                                    [(ulong)*(uint8_t *)
                                             ((long)local_70 + lVar63 * 2 + (ulong)(uVar50 * 6)) * 2
                                     + (ulong)bVar1 * 0x200] * 0x1f + 0x7f) / 0xff);
        lVar63 = lVar63 + 1;
      } while (lVar63 != 3);
      lVar52 = lVar52 + 1;
      pcVar64 = pcVar64 + 1;
    } while (lVar52 != 3);
    lVar52 = 0;
    do {
      dst_blk->m_selectors[lVar52] = (unpacked_src_blk->m_astc).m_weights[lVar52];
      lVar52 = lVar52 + 1;
    } while (lVar52 != 0x10);
    break;
  case 8:
    uVar55 = (ulong)(unpacked_src_blk->m_solid_color).field_0.field_0.r;
    uVar59 = (ulong)(unpacked_src_blk->m_solid_color).field_0.field_0.g;
    uVar60 = (ulong)(unpacked_src_blk->m_solid_color).field_0.field_0.b;
    uVar61 = (ulong)(unpacked_src_blk->m_solid_color).field_0.field_0.a;
    uVar56 = (uint)*(ushort *)(&DAT_0029e874 + uVar61 * 8) +
             (uint)*(ushort *)(&DAT_0029e874 + uVar60 * 8) +
             (uint)*(ushort *)(&DAT_0029e874 + uVar59 * 8) +
             (uint)*(ushort *)(&DAT_0029e874 + uVar55 * 8);
    uVar54 = (uint)(ushort)(&g_bc7_mode_6_optimal_endpoints)[uVar61 * 4] +
             (uint)(ushort)(&g_bc7_mode_6_optimal_endpoints)[uVar60 * 4] +
             (uint)(ushort)(&g_bc7_mode_6_optimal_endpoints)[uVar59 * 4] +
             (uint)(ushort)(&g_bc7_mode_6_optimal_endpoints)[uVar55 * 4];
    if ((uVar54 == 0) || (uVar56 == 0)) {
      dst_blk->m_mode = 6;
      lVar63 = 0;
      lVar52 = (ulong)(uVar56 < uVar54) * 4;
      do {
        dst_blk->m_low[0].m_c[lVar63] =
             (&DAT_0029e872)
             [lVar52 + (ulong)*(byte *)((long)(&unpacked_src_blk->m_astc + 1) + lVar63 + 8) * 8];
        dst_blk->m_high[0].m_c[lVar63] =
             (&DAT_0029e873)
             [lVar52 + (ulong)*(byte *)((long)(&unpacked_src_blk->m_astc + 1) + lVar63 + 8) * 8];
        lVar63 = lVar63 + 1;
      } while (lVar63 != 4);
      dst_blk->m_pbits[0][0] = (uint)(uVar56 < uVar54);
      dst_blk->m_pbits[0][1] = (uint)(uVar56 < uVar54);
      builtin_memcpy(dst_blk->m_selectors,
                     "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05",0x10);
    }
    else {
      dst_blk->m_mode = 5;
      lVar52 = 0;
      do {
        dst_blk->m_low[0].m_c[lVar52] =
             (&DAT_0029f072)
             [(ulong)*(byte *)((long)(&unpacked_src_blk->m_astc + 1) + lVar52 + 8) * 4];
        dst_blk->m_high[0].m_c[lVar52] =
             (&DAT_0029f073)
             [(ulong)*(byte *)((long)(&unpacked_src_blk->m_astc + 1) + lVar52 + 8) * 4];
        lVar52 = lVar52 + 1;
      } while (lVar52 != 3);
      builtin_memcpy(dst_blk->m_selectors,
                     "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
      dst_blk->m_low[0].m_c[3] = (unpacked_src_blk->m_solid_color).field_0.field_0.a;
      dst_blk->m_high[0].m_c[3] = (unpacked_src_blk->m_solid_color).field_0.field_0.a;
    }
    break;
  case 9:
  case 0x10:
    dst_blk->m_mode = 7;
    dst_blk->m_partition =
         (uint)(byte)g_astc_bc7_common_partitions2[(ulong)unpacked_src_blk->m_common_pattern * 6];
    local_70 = (color_quad_u8 *)
               CONCAT71(local_70._1_7_,
                        g_astc_bc7_common_partitions2
                        [(ulong)unpacked_src_blk->m_common_pattern * 6 + 4]);
    local_68 = uVar55 - 0xf;
    local_58 = (unpacked_src_blk->m_astc).m_endpoints;
    puVar57 = (unpacked_src_blk->m_astc).m_endpoints + 7;
    lVar65 = 1;
    local_60 = g_astc_unquant + (ulong)bVar1 * 0x200;
    local_48 = 0x437f0000;
    uStack_44 = 0x437f0000;
    uStack_40 = 0x437f0000;
    uStack_3c = 0x437f0000;
    lVar52 = (ulong)bVar1 * 0x200;
    local_50 = g_astc_unquant + lVar52;
    lVar63 = 0;
    do {
      if (local_68 < 3) {
        fStack_90 = (float)(byte)local_60[(ulong)(unpacked_src_blk->m_astc).m_endpoints
                                                 [lVar63 * 4 + 1] * 2] / 255.0;
        local_98 = CONCAT44(fStack_90,fStack_90);
        auVar71._0_4_ =
             (float)(byte)local_60[(ulong)(unpacked_src_blk->m_astc).m_endpoints[lVar63 * 4] * 2];
        auVar71._4_4_ = auVar71._0_4_;
        auVar71._8_4_ = auVar71._0_4_;
        auVar71._12_4_ =
             (float)(byte)local_60[(ulong)(unpacked_src_blk->m_astc).m_endpoints[lVar63 * 4 + 2] * 2
                                  ];
        auVar87._4_4_ = uStack_44;
        auVar87._0_4_ = local_48;
        auVar87._8_4_ = uStack_40;
        auVar87._12_4_ = uStack_3c;
        _local_88 = divps(auVar71,auVar87);
        puVar51 = local_58 + lVar63 * 4 + 3;
      }
      else {
        auVar31[0xc] = g_astc_unquant[(ulong)puVar57[-1] * 2 + lVar52];
        auVar31._0_12_ = ZEXT712(0);
        auVar69._0_4_ = (float)(byte)g_astc_unquant[(ulong)puVar57[-7] * 2 + lVar52];
        auVar69._4_4_ =
             (float)(byte)g_astc_unquant[(ulong)(byte)*(int *)(puVar57 + -5) * 2 + lVar52];
        auVar69._8_4_ =
             (float)(int)CONCAT32(auVar31._10_3_,
                                  (ushort)(byte)g_astc_unquant[(ulong)puVar57[-3] * 2 + lVar52]);
        auVar69._12_4_ = (float)(uint3)(auVar31._10_3_ >> 0x10);
        _local_88 = divps(auVar69,_DAT_001e9920);
        auVar72._0_4_ = (float)(byte)g_astc_unquant[(ulong)puVar57[-6] * 2 + lVar52];
        auVar72._4_4_ = (float)(byte)g_astc_unquant[(ulong)puVar57[-4] * 2 + lVar52];
        auVar72._8_8_ = 0;
        auVar69 = divps(auVar72,_DAT_001e9930);
        local_98 = auVar69._0_8_;
        fStack_90 = (float)(byte)g_astc_unquant[(ulong)puVar57[-2] * 2 + lVar52] / 255.0;
        puVar51 = puVar57;
      }
      fStack_8c = (float)(byte)local_50[(ulong)*puVar51 * 2] / 255.0;
      local_a0[0] = 0;
      local_a0[1] = 0;
      local_a8.m_c[0] = '\0';
      local_a8.m_c[1] = '\0';
      local_a8.m_c[2] = '\0';
      local_a8.m_c[3] = '\0';
      local_a4.m_c[0] = '\0';
      local_a4.m_c[1] = '\0';
      local_a4.m_c[2] = '\0';
      local_a4.m_c[3] = '\0';
      determine_unique_pbits(4,5,(float *)local_88,(float *)&local_98,&local_a8,&local_a4,local_a0);
      uVar54 = (uint)lVar63;
      if ((char)local_70 != '\0') {
        uVar54 = (uint)lVar65;
      }
      *&dst_blk->m_low[uVar54].m_c = local_a8.m_c;
      *&dst_blk->m_high[uVar54].m_c = local_a4.m_c;
      dst_blk->m_pbits[uVar54] = local_a0;
      lVar63 = lVar63 + 1;
      puVar57 = puVar57 + 8;
      lVar65 = lVar65 + -1;
    } while (lVar65 == 0);
    lVar52 = 0;
    do {
      dst_blk->m_selectors[lVar52] = (unpacked_src_blk->m_astc).m_weights[lVar52];
      lVar52 = lVar52 + 1;
    } while (lVar52 != 0x10);
  }
  return true;
}

Assistant:

bool transcode_uastc_to_bc7(const unpacked_uastc_block& unpacked_src_blk, bc7_optimization_results& dst_blk)
	{
		memset(&dst_blk, 0, sizeof(dst_blk));

		const uint32_t mode = unpacked_src_blk.m_mode;

		const uint32_t endpoint_range = g_uastc_mode_endpoint_ranges[mode];
		const uint32_t total_comps = g_uastc_mode_comps[mode];

		switch (mode)
		{
		case 0:
		case 5:
		case 10:
		case 12:
		case 14:
		case 15:
		case 18:
		{
			// MODE 0: DualPlane: 0, WeightRange: 8 (16), Subsets: 1, EndpointRange: 19 (192) - BC7 MODE6 RGB
			// MODE 5: DualPlane: 0, WeightRange : 5 (8), Subsets : 1, EndpointRange : 20 (256) - BC7 MODE6 RGB
			// MODE 10 DualPlane: 0, WeightRange: 8 (16), Subsets: 1, EndpointRange: 13 (48) - BC7 MODE6
			// MODE 12: DualPlane: 0, WeightRange : 5 (8), Subsets : 1, EndpointRange : 19 (192) - BC7 MODE6
			// MODE 14: DualPlane: 0, WeightRange : 2 (4), Subsets : 1, EndpointRange : 20 (256) - BC7 MODE6
			// MODE 18: DualPlane: 0, WeightRange : 11 (32), Subsets : 1, CEM : 8, EndpointRange : 11 (32) - BC7 MODE6
			// MODE 15: DualPlane: 0, WeightRange : 8 (16), Subsets : 1, CEM : 4 (LA Direct), EndpointRange : 20 (256) - BC7 MODE6
			dst_blk.m_mode = 6;

			float xl[4], xh[4];
			if (total_comps == 2)
			{
				xl[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[0]].m_unquant / 255.0f;
				xh[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[1]].m_unquant / 255.0f;

				xl[1] = xl[0];
				xh[1] = xh[0];

				xl[2] = xl[0];
				xh[2] = xh[0];

				xl[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[2]].m_unquant / 255.0f;
				xh[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[3]].m_unquant / 255.0f;
			}
			else
			{
				xl[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[0]].m_unquant / 255.0f;
				xl[1] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[2]].m_unquant / 255.0f;
				xl[2] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[4]].m_unquant / 255.0f;

				xh[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[1]].m_unquant / 255.0f;
				xh[1] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[3]].m_unquant / 255.0f;
				xh[2] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[5]].m_unquant / 255.0f;

				if (total_comps == 4)
				{
					xl[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[6]].m_unquant / 255.0f;
					xh[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[7]].m_unquant / 255.0f;
				}
				else
				{
					xl[3] = 1.0f;
					xh[3] = 1.0f;
				}
			}

			uint32_t best_pbits[2];
			color_quad_u8 bestMinColor, bestMaxColor;
			determine_unique_pbits((total_comps == 2) ? 4 : total_comps, 7, xl, xh, bestMinColor, bestMaxColor, best_pbits);

			dst_blk.m_low[0] = bestMinColor;
			dst_blk.m_high[0] = bestMaxColor;

			if (total_comps == 3)
			{
				dst_blk.m_low[0].m_c[3] = 127;
				dst_blk.m_high[0].m_c[3] = 127;
			}

			dst_blk.m_pbits[0][0] = best_pbits[0];
			dst_blk.m_pbits[0][1] = best_pbits[1];

			if (mode == 18)
			{
				const uint8_t s_bc7_5_to_4[32] = { 0, 0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 6, 6, 7, 8, 9, 9, 9, 10, 10, 11, 11, 12, 12, 13, 13, 14, 14, 15, 15 };
				for (uint32_t i = 0; i < 16; i++)
					dst_blk.m_selectors[i] = s_bc7_5_to_4[unpacked_src_blk.m_astc.m_weights[i]];
			}
			else if (mode == 14)
			{
				const uint8_t s_bc7_2_to_4[4] = { 0, 5, 10, 15 };
				for (uint32_t i = 0; i < 16; i++)
					dst_blk.m_selectors[i] = s_bc7_2_to_4[unpacked_src_blk.m_astc.m_weights[i]];
			}
			else if ((mode == 5) || (mode == 12))
			{
				const uint8_t s_bc7_3_to_4[8] = { 0, 2, 4, 6, 9, 11, 13, 15 };
				for (uint32_t i = 0; i < 16; i++)
					dst_blk.m_selectors[i] = s_bc7_3_to_4[unpacked_src_blk.m_astc.m_weights[i]];
			}
			else
			{
				for (uint32_t i = 0; i < 16; i++)
					dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];
			}

			break;
		}
		case 1:
		{
			// DualPlane: 0, WeightRange : 2 (4), Subsets : 1, EndpointRange : 20 (256) - BC7 MODE3
			// Mode 1 uses endpoint range 20 - no need to use ASTC dequant tables.
			dst_blk.m_mode = 3;

			float xl[4], xh[4];
			xl[0] = unpacked_src_blk.m_astc.m_endpoints[0] / 255.0f;
			xl[1] = unpacked_src_blk.m_astc.m_endpoints[2] / 255.0f;
			xl[2] = unpacked_src_blk.m_astc.m_endpoints[4] / 255.0f;
			xl[3] = 1.0f;

			xh[0] = unpacked_src_blk.m_astc.m_endpoints[1] / 255.0f;
			xh[1] = unpacked_src_blk.m_astc.m_endpoints[3] / 255.0f;
			xh[2] = unpacked_src_blk.m_astc.m_endpoints[5] / 255.0f;
			xh[3] = 1.0f;

			uint32_t best_pbits[2];
			color_quad_u8 bestMinColor, bestMaxColor;
			memset(&bestMinColor, 0, sizeof(bestMinColor));
			memset(&bestMaxColor, 0, sizeof(bestMaxColor));
			determine_unique_pbits(3, 7, xl, xh, bestMinColor, bestMaxColor, best_pbits);

			for (uint32_t i = 0; i < 3; i++)
			{
				dst_blk.m_low[0].m_c[i] = bestMinColor.m_c[i];
				dst_blk.m_high[0].m_c[i] = bestMaxColor.m_c[i];
				dst_blk.m_low[1].m_c[i] = bestMinColor.m_c[i];
				dst_blk.m_high[1].m_c[i] = bestMaxColor.m_c[i];
			}
			dst_blk.m_pbits[0][0] = best_pbits[0];
			dst_blk.m_pbits[0][1] = best_pbits[1];
			dst_blk.m_pbits[1][0] = best_pbits[0];
			dst_blk.m_pbits[1][1] = best_pbits[1];

			for (uint32_t i = 0; i < 16; i++)
				dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];

			break;
		}
		case 2:
		{
			// 2. DualPlane: 0, WeightRange : 5 (8), Subsets : 2, EndpointRange : 8 (16) - BC7 MODE1 
			dst_blk.m_mode = 1;
			dst_blk.m_partition = g_astc_bc7_common_partitions2[unpacked_src_blk.m_common_pattern].m_bc7;

			const bool invert_partition = g_astc_bc7_common_partitions2[unpacked_src_blk.m_common_pattern].m_invert;

			float xl[4], xh[4];
			xl[3] = 1.0f;
			xh[3] = 1.0f;

			for (uint32_t subset = 0; subset < 2; subset++)
			{
				for (uint32_t i = 0; i < 3; i++)
				{
					uint32_t v = unpacked_src_blk.m_astc.m_endpoints[i * 2 + subset * 6];
					v = (v << 4) | v;
					xl[i] = v / 255.0f;

					v = unpacked_src_blk.m_astc.m_endpoints[i * 2 + subset * 6 + 1];
					v = (v << 4) | v;
					xh[i] = v / 255.0f;
				}

				uint32_t best_pbits[2] = { 0, 0 };
				color_quad_u8 bestMinColor, bestMaxColor;
				memset(&bestMinColor, 0, sizeof(bestMinColor));
				memset(&bestMaxColor, 0, sizeof(bestMaxColor));
				determine_shared_pbits(3, 6, xl, xh, bestMinColor, bestMaxColor, best_pbits);

				const uint32_t bc7_subset_index = invert_partition ? (1 - subset) : subset;

				for (uint32_t i = 0; i < 3; i++)
				{
					dst_blk.m_low[bc7_subset_index].m_c[i] = bestMinColor.m_c[i];
					dst_blk.m_high[bc7_subset_index].m_c[i] = bestMaxColor.m_c[i];
				}

				dst_blk.m_pbits[bc7_subset_index][0] = best_pbits[0];
			} // subset

			for (uint32_t i = 0; i < 16; i++)
				dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];

			break;
		}
		case 3:
		{
			// DualPlane: 0, WeightRange : 2 (4), Subsets : 3, EndpointRange : 7 (12) - BC7 MODE2
			dst_blk.m_mode = 2;
			dst_blk.m_partition = g_astc_bc7_common_partitions3[unpacked_src_blk.m_common_pattern].m_bc7;

			const uint32_t perm = g_astc_bc7_common_partitions3[unpacked_src_blk.m_common_pattern].m_astc_to_bc7_perm;

			for (uint32_t subset = 0; subset < 3; subset++)
			{
				for (uint32_t comp = 0; comp < 3; comp++)
				{
					uint32_t lo = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[comp * 2 + 0 + subset * 6]].m_unquant;
					uint32_t hi = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[comp * 2 + 1 + subset * 6]].m_unquant;

					// TODO: I think this can be improved by using tables like Basis Universal does with ETC1S conversion.
					lo = (lo * 31 + 127) / 255;
					hi = (hi * 31 + 127) / 255;

					const uint32_t bc7_subset_index = g_astc_to_bc7_partition_index_perm_tables[perm][subset];

					dst_blk.m_low[bc7_subset_index].m_c[comp] = (uint8_t)lo;
					dst_blk.m_high[bc7_subset_index].m_c[comp] = (uint8_t)hi;
				}
			}

			for (uint32_t i = 0; i < 16; i++)
				dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];

			break;
		}
		case 4:
		{
			// 4. DualPlane: 0, WeightRange: 2 (4), Subsets: 2, EndpointRange: 12 (40) - BC7 MODE3
			dst_blk.m_mode = 3;
			dst_blk.m_partition = g_astc_bc7_common_partitions2[unpacked_src_blk.m_common_pattern].m_bc7;

			const bool invert_partition = g_astc_bc7_common_partitions2[unpacked_src_blk.m_common_pattern].m_invert;

			float xl[4], xh[4];
			xl[3] = 1.0f;
			xh[3] = 1.0f;

			for (uint32_t subset = 0; subset < 2; subset++)
			{
				for (uint32_t i = 0; i < 3; i++)
				{
					xl[i] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[i * 2 + subset * 6]].m_unquant / 255.0f;
					xh[i] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[i * 2 + subset * 6 + 1]].m_unquant / 255.0f;
				}

				uint32_t best_pbits[2] = { 0, 0 };
				color_quad_u8 bestMinColor, bestMaxColor;
				memset(&bestMinColor, 0, sizeof(bestMinColor));
				memset(&bestMaxColor, 0, sizeof(bestMaxColor));
				determine_unique_pbits(3, 7, xl, xh, bestMinColor, bestMaxColor, best_pbits);

				const uint32_t bc7_subset_index = invert_partition ? (1 - subset) : subset;

				for (uint32_t i = 0; i < 3; i++)
				{
					dst_blk.m_low[bc7_subset_index].m_c[i] = bestMinColor.m_c[i];
					dst_blk.m_high[bc7_subset_index].m_c[i] = bestMaxColor.m_c[i];
				}
				dst_blk.m_low[bc7_subset_index].m_c[3] = 127;
				dst_blk.m_high[bc7_subset_index].m_c[3] = 127;

				dst_blk.m_pbits[bc7_subset_index][0] = best_pbits[0];
				dst_blk.m_pbits[bc7_subset_index][1] = best_pbits[1];

			} // subset

			for (uint32_t i = 0; i < 16; i++)
				dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];

			break;
		}
		case 6:
		case 11:
		case 13:
		case 17:
		{
			// MODE 6: DualPlane: 1, WeightRange : 2 (4), Subsets : 1, EndpointRange : 18 (160) - BC7 MODE5 RGB
			// MODE 11: DualPlane: 1, WeightRange: 2 (4), Subsets: 1, EndpointRange: 13 (48) - BC7 MODE5
			// MODE 13: DualPlane: 1, WeightRange: 0 (2), Subsets : 1, EndpointRange : 20 (256) - BC7 MODE5
			// MODE 17: DualPlane: 1, WeightRange: 2 (4), Subsets: 1, CEM: 4 (LA Direct), EndpointRange: 20 (256) - BC7 MODE5
			dst_blk.m_mode = 5;
			dst_blk.m_rotation = (unpacked_src_blk.m_astc.m_ccs + 1) & 3;

			if (total_comps == 2)
			{
				assert(unpacked_src_blk.m_astc.m_ccs == 3);

				dst_blk.m_low->m_c[0] = (uint8_t)((g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[0]].m_unquant * 127 + 127) / 255);
				dst_blk.m_high->m_c[0] = (uint8_t)((g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[1]].m_unquant * 127 + 127) / 255);

				dst_blk.m_low->m_c[1] = dst_blk.m_low->m_c[0];
				dst_blk.m_high->m_c[1] = dst_blk.m_high->m_c[0];

				dst_blk.m_low->m_c[2] = dst_blk.m_low->m_c[0];
				dst_blk.m_high->m_c[2] = dst_blk.m_high->m_c[0];

				dst_blk.m_low->m_c[3] = (uint8_t)(g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[2]].m_unquant);
				dst_blk.m_high->m_c[3] = (uint8_t)(g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[3]].m_unquant);
			}
			else
			{
				for (uint32_t astc_comp = 0; astc_comp < 4; astc_comp++)
				{
					uint32_t bc7_comp = astc_comp;
					// ASTC and BC7 handle dual plane component rotations differently:
					// ASTC: 2nd plane separately interpolates the CCS channel.
					// BC7: 2nd plane channel is swapped with alpha, 2nd plane controls alpha interpolation, then we swap alpha with the desired channel.
					if (astc_comp == (uint32_t)unpacked_src_blk.m_astc.m_ccs)
						bc7_comp = 3;
					else if (astc_comp == 3)
						bc7_comp = unpacked_src_blk.m_astc.m_ccs;

					uint32_t l = 255, h = 255;
					if (astc_comp < total_comps)
					{
						l = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[astc_comp * 2 + 0]].m_unquant;
						h = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[astc_comp * 2 + 1]].m_unquant;
					}

					if (bc7_comp < 3)
					{
						l = (l * 127 + 127) / 255;
						h = (h * 127 + 127) / 255;
					}

					dst_blk.m_low->m_c[bc7_comp] = (uint8_t)l;
					dst_blk.m_high->m_c[bc7_comp] = (uint8_t)h;
				}
			}

			if (mode == 13)
			{
				for (uint32_t i = 0; i < 16; i++)
				{
					dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i * 2] ? 3 : 0;
					dst_blk.m_alpha_selectors[i] = unpacked_src_blk.m_astc.m_weights[i * 2 + 1] ? 3 : 0;
				}
			}
			else
			{
				for (uint32_t i = 0; i < 16; i++)
				{
					dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i * 2];
					dst_blk.m_alpha_selectors[i] = unpacked_src_blk.m_astc.m_weights[i * 2 + 1];
				}
			}

			break;
		}
		case 7:
		{
			// DualPlane: 0, WeightRange : 2 (4), Subsets : 2, EndpointRange : 12 (40) - BC7 MODE2
			dst_blk.m_mode = 2;
			dst_blk.m_partition = g_bc7_3_astc2_common_partitions[unpacked_src_blk.m_common_pattern].m_bc73;

			const uint32_t common_pattern_k = g_bc7_3_astc2_common_partitions[unpacked_src_blk.m_common_pattern].k;

			for (uint32_t bc7_part = 0; bc7_part < 3; bc7_part++)
			{
				const uint32_t astc_part = bc7_convert_partition_index_3_to_2(bc7_part, common_pattern_k);

				for (uint32_t c = 0; c < 3; c++)
				{
					dst_blk.m_low[bc7_part].m_c[c] = (g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[c * 2 + 0 + astc_part * 6]].m_unquant * 31 + 127) / 255;
					dst_blk.m_high[bc7_part].m_c[c] = (g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[c * 2 + 1 + astc_part * 6]].m_unquant * 31 + 127) / 255;
				}
			}

			for (uint32_t i = 0; i < 16; i++)
				dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];

			break;
		}
		case UASTC_MODE_INDEX_SOLID_COLOR:
		{
			// Void-Extent: Solid Color RGBA (BC7 MODE5 or MODE6)
			const color32& solid_color = unpacked_src_blk.m_solid_color;

			uint32_t best_err0 = g_bc7_mode_6_optimal_endpoints[solid_color.r][0].m_error + g_bc7_mode_6_optimal_endpoints[solid_color.g][0].m_error +
				g_bc7_mode_6_optimal_endpoints[solid_color.b][0].m_error + g_bc7_mode_6_optimal_endpoints[solid_color.a][0].m_error;

			uint32_t best_err1 = g_bc7_mode_6_optimal_endpoints[solid_color.r][1].m_error + g_bc7_mode_6_optimal_endpoints[solid_color.g][1].m_error +
				g_bc7_mode_6_optimal_endpoints[solid_color.b][1].m_error + g_bc7_mode_6_optimal_endpoints[solid_color.a][1].m_error;

			if (best_err0 > 0 && best_err1 > 0)
			{
				dst_blk.m_mode = 5;

				for (uint32_t c = 0; c < 3; c++)
				{
					dst_blk.m_low[0].m_c[c] = g_bc7_mode_5_optimal_endpoints[solid_color.c[c]].m_lo;
					dst_blk.m_high[0].m_c[c] = g_bc7_mode_5_optimal_endpoints[solid_color.c[c]].m_hi;
				}

				memset(dst_blk.m_selectors, BC7ENC_MODE_5_OPTIMAL_INDEX, 16);

				dst_blk.m_low[0].m_c[3] = solid_color.c[3];
				dst_blk.m_high[0].m_c[3] = solid_color.c[3];

				//memset(dst_blk.m_alpha_selectors, 0, 16);
			}
			else
			{
				dst_blk.m_mode = 6;

				uint32_t best_p = 0;
				if (best_err1 < best_err0)
					best_p = 1;

				for (uint32_t c = 0; c < 4; c++)
				{
					dst_blk.m_low[0].m_c[c] = g_bc7_mode_6_optimal_endpoints[solid_color.c[c]][best_p].m_lo;
					dst_blk.m_high[0].m_c[c] = g_bc7_mode_6_optimal_endpoints[solid_color.c[c]][best_p].m_hi;
				}

				dst_blk.m_pbits[0][0] = best_p;
				dst_blk.m_pbits[0][1] = best_p;
				memset(dst_blk.m_selectors, BC7ENC_MODE_6_OPTIMAL_INDEX, 16);
			}

			break;
		}
		case 9:
		case 16:
		{
			// 9. DualPlane: 0, WeightRange : 2 (4), Subsets : 2, EndpointRange : 8 (16) - BC7 MODE7
			// 16. DualPlane: 0, WeightRange: 2 (4), Subsets: 2, CEM: 4 (LA Direct), EndpointRange: 20 (256) - BC7 MODE7

			dst_blk.m_mode = 7;
			dst_blk.m_partition = g_astc_bc7_common_partitions2[unpacked_src_blk.m_common_pattern].m_bc7;

			const bool invert_partition = g_astc_bc7_common_partitions2[unpacked_src_blk.m_common_pattern].m_invert;

			for (uint32_t astc_subset = 0; astc_subset < 2; astc_subset++)
			{
				float xl[4], xh[4];

				if (total_comps == 2)
				{
					xl[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[0 + astc_subset * 4]].m_unquant / 255.0f;
					xh[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[1 + astc_subset * 4]].m_unquant / 255.0f;

					xl[1] = xl[0];
					xh[1] = xh[0];

					xl[2] = xl[0];
					xh[2] = xh[0];

					xl[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[2 + astc_subset * 4]].m_unquant / 255.0f;
					xh[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[3 + astc_subset * 4]].m_unquant / 255.0f;
				}
				else
				{
					xl[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[0 + astc_subset * 8]].m_unquant / 255.0f;
					xl[1] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[2 + astc_subset * 8]].m_unquant / 255.0f;
					xl[2] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[4 + astc_subset * 8]].m_unquant / 255.0f;
					xl[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[6 + astc_subset * 8]].m_unquant / 255.0f;

					xh[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[1 + astc_subset * 8]].m_unquant / 255.0f;
					xh[1] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[3 + astc_subset * 8]].m_unquant / 255.0f;
					xh[2] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[5 + astc_subset * 8]].m_unquant / 255.0f;
					xh[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[7 + astc_subset * 8]].m_unquant / 255.0f;
				}

				uint32_t best_pbits[2] = { 0, 0 };
				color_quad_u8 bestMinColor, bestMaxColor;
				memset(&bestMinColor, 0, sizeof(bestMinColor));
				memset(&bestMaxColor, 0, sizeof(bestMaxColor));
				determine_unique_pbits(4, 5, xl, xh, bestMinColor, bestMaxColor, best_pbits);

				const uint32_t bc7_subset_index = invert_partition ? (1 - astc_subset) : astc_subset;

				dst_blk.m_low[bc7_subset_index] = bestMinColor;
				dst_blk.m_high[bc7_subset_index] = bestMaxColor;

				dst_blk.m_pbits[bc7_subset_index][0] = best_pbits[0];
				dst_blk.m_pbits[bc7_subset_index][1] = best_pbits[1];
			} // astc_subset

			for (uint32_t i = 0; i < 16; i++)
				dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];

			break;
		}
		default:
			return false;
		}

		return true;
	}